

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btOverlappingPairCache.cpp
# Opt level: O2

void __thiscall
btSortedOverlappingPairCache::btSortedOverlappingPairCache(btSortedOverlappingPairCache *this)

{
  (this->super_btOverlappingPairCache).super_btOverlappingPairCallback.
  _vptr_btOverlappingPairCallback = (_func_int **)&PTR__btSortedOverlappingPairCache_001ec498;
  (this->m_overlappingPairArray).m_ownsMemory = true;
  (this->m_overlappingPairArray).m_data = (btBroadphasePair *)0x0;
  (this->m_overlappingPairArray).m_size = 0;
  (this->m_overlappingPairArray).m_capacity = 0;
  this->m_blockedForChanges = false;
  this->m_hasDeferredRemoval = true;
  this->m_overlapFilterCallback = (btOverlapFilterCallback *)0x0;
  this->m_ghostPairCallback = (btOverlappingPairCallback *)0x0;
  btAlignedObjectArray<btBroadphasePair>::reserve(&this->m_overlappingPairArray,2);
  return;
}

Assistant:

btSortedOverlappingPairCache::btSortedOverlappingPairCache():
	m_blockedForChanges(false),
	m_hasDeferredRemoval(true),
	m_overlapFilterCallback(0),
	m_ghostPairCallback(0)
{
	int initialAllocatedSize= 2;
	m_overlappingPairArray.reserve(initialAllocatedSize);
}